

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O1

string * cm_archive_error_string_abi_cxx11_(string *__return_storage_ptr__,archive *a)

{
  char *pcVar1;
  size_t sVar2;
  char *__s;
  
  pcVar1 = archive_error_string(a);
  __s = "unknown error";
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar2);
  return __return_storage_ptr__;
}

Assistant:

static std::string cm_archive_error_string(struct archive* a)
{
  const char* e = archive_error_string(a);
  return e? e : "unknown error";
}